

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalcmeanonly.cpp
# Opt level: O0

void aalcalcmeanonly::ReadInputStream(FILE *fin)

{
  int iVar1;
  sampleslevelRec *psVar2;
  mapped_type *this;
  reference pvVar3;
  bool bVar4;
  double dVar5;
  int local_38;
  float local_34;
  sampleslevelRec sr;
  double weight;
  size_t i;
  key_type kStack_18;
  summarySampleslevelHeader sh;
  FILE *fin_local;
  
  sh._4_8_ = fin;
  weight = (double)fread((void *)((long)&i + 4),0xc,1,(FILE *)fin);
  do {
    if (weight == 0.0) {
      return;
    }
    psVar2 = (sampleslevelRec *)
             std::
             unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
             ::operator[]((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                           *)eventToWeighting_,(key_type *)((long)&i + 4));
    sr = *psVar2;
    while (weight != 0.0) {
      weight = (double)fread(&local_38,8,1,(FILE *)sh._4_8_);
      if ((local_38 != -4) && (local_38 != -5)) {
        if ((weight == 0.0) || (local_38 == 0)) break;
        dVar5 = (double)local_34 * (double)sr;
        iVar1 = sampleSize_ + -1;
        bVar4 = local_38 != -1;
        this = std::
               map<int,_std::array<double,_2UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::array<double,_2UL>_>_>_>
               ::operator[]((map<int,_std::array<double,_2UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::array<double,_2UL>_>_>_>
                             *)means_,&kStack_18);
        pvVar3 = std::array<double,_2UL>::operator[](this,(ulong)(local_38 != -1));
        *pvVar3 = dVar5 / (double)(int)(iVar1 * (uint)bVar4 + 1) + *pvVar3;
      }
    }
    weight = (double)fread((void *)((long)&i + 4),0xc,1,(FILE *)sh._4_8_);
  } while( true );
}

Assistant:

inline void ReadInputStream(FILE *fin) {

    summarySampleslevelHeader sh;
    size_t i = fread(&sh, sizeof(sh), 1, fin);
    while (i != 0) {

      double weight = eventToWeighting_[sh.event_id];

      while (i != 0) {

        sampleslevelRec sr;
        i = fread(&sr, sizeof(sr), 1, fin);

        if (sr.sidx == number_of_affected_risk_idx || sr.sidx == max_loss_idx) continue;
        if (i == 0 || sr.sidx == 0) break;

        means_[sh.summary_id][sr.sidx != -1] += (sr.loss * weight / (1 + (sampleSize_ - 1) * (sr.sidx != -1)));

      }

      i = fread(&sh, sizeof(sh), 1, fin);

    }

  }